

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_> *
__thiscall
CfgNode::BlockData::signalHandlers
          (set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
           *__return_storage_ptr__,BlockData *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator __i;
  insert_iterator<std::set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>_>
  iVar3;
  BlockData *this_local;
  set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
  *cfgSignalHandlers;
  
  std::set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>::
  set(__return_storage_ptr__);
  cVar1 = std::
          map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
          ::begin(&this->m_signalHandlers);
  cVar2 = std::
          map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
          ::end(&this->m_signalHandlers);
  __i = std::
        set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
        ::begin(__return_storage_ptr__);
  iVar3 = std::
          inserter<std::set<CfgSignalHandler*,std::less<CfgSignalHandler*>,std::allocator<CfgSignalHandler*>>>
                    (__return_storage_ptr__,__i);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<int_const,CfgSignalHandler*>>,std::insert_iterator<std::set<CfgSignalHandler*,std::less<CfgSignalHandler*>,std::allocator<CfgSignalHandler*>>>,CfgNode::BlockData::signalHandlers()const::__0>
            (cVar1._M_node,cVar2._M_node,iVar3.container,iVar3.iter._M_node._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgSignalHandler*> CfgNode::BlockData::signalHandlers() const {
	std::set<CfgSignalHandler*> cfgSignalHandlers;

	std::transform(m_signalHandlers.begin(), m_signalHandlers.end(),
			std::inserter(cfgSignalHandlers, cfgSignalHandlers.begin()),
			[](const std::map<int, CfgSignalHandler*>::value_type &pair) {
					return pair.second;
			}
	);

	return cfgSignalHandlers;
}